

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ExportedTableInfo>
          (Serializer *this,vector<duckdb::ExportedTableInfo,_true> *vec)

{
  pointer pEVar1;
  long lVar2;
  ExportedTableInfo *item;
  pointer value;
  
  lVar2 = (long)(vec->
                super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>)
                .
                super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->
                super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>)
                .
                super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (*this->_vptr_Serializer[8])(this,lVar2 / 0xa0,lVar2 % 0xa0);
  pEVar1 = (vec->super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
           ).
           super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (value = (vec->
               super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>).
               super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
               ._M_impl.super__Vector_impl_data._M_start; value != pEVar1; value = value + 1) {
    WriteValue<duckdb::ExportedTableInfo>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}